

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O2

void redraw_game_windows(void)

{
  gamewin *pgVar1;
  WINDOW *pWVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  gamewin **ppgVar6;
  
  if (basewin == (WINDOW *)0x0) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    uVar4 = (ulong)((int)basewin->_maxy + 1);
  }
  wredrawln(basewin,0,uVar4);
  wnoutrefresh(basewin);
  if (ui_flags.ingame != '\0') {
    iVar5 = -1;
    iVar3 = -1;
    if (mapwin != (WINDOW *)0x0) {
      iVar3 = mapwin->_maxy + 1;
    }
    wredrawln(mapwin,0,iVar3);
    if (msgwin != (WINDOW *)0x0) {
      iVar5 = msgwin->_maxy + 1;
    }
    wredrawln(msgwin,0,iVar5);
    wnoutrefresh(mapwin);
    wnoutrefresh(msgwin);
    if (statuswin != (WINDOW *)0x0) {
      wredrawln(statuswin,0,statuswin->_maxy + 1);
      wnoutrefresh(statuswin);
    }
    if (sidebar != (WINDOW *)0x0) {
      draw_sidebar_divider();
      if (sidebar == (WINDOW *)0x0) {
        uVar4 = 0xffffffffffffffff;
      }
      else {
        uVar4 = (ulong)((int)sidebar->_maxy + 1);
      }
      wredrawln(sidebar,0,uVar4);
      wnoutrefresh(sidebar);
    }
    draw_frame();
  }
  ppgVar6 = &firstgw;
  while (pgVar1 = *ppgVar6, pgVar1 != (gamewin *)0x0) {
    (*pgVar1->draw)(pgVar1);
    pWVar2 = pgVar1->win;
    iVar5 = -1;
    if (pWVar2 != (WINDOW *)0x0) {
      iVar5 = pWVar2->_maxy + 1;
    }
    wredrawln(pWVar2,0,iVar5);
    wnoutrefresh(pgVar1->win);
    ppgVar6 = &pgVar1->next;
  }
  return;
}

Assistant:

void redraw_game_windows(void)
{
    struct gamewin *gw;
    
    redrawwin(basewin);
    wnoutrefresh(basewin);
    
    if (ui_flags.ingame) {
	redrawwin(mapwin);
	redrawwin(msgwin);
	
	wnoutrefresh(mapwin);
	wnoutrefresh(msgwin);
	
	/* statuswin can become NULL if the terminal is resized to microscopic dimensions */
	if (statuswin) {
	    redrawwin(statuswin);
	    wnoutrefresh(statuswin);
	}
	
	if (sidebar) {
	    draw_sidebar_divider();
	    redrawwin(sidebar);
	    wnoutrefresh(sidebar);
	}
	
	draw_frame();
    }
    
    for (gw = firstgw; gw; gw = gw->next) {
	gw->draw(gw);
	redrawwin(gw->win);
	wnoutrefresh(gw->win);
    }
}